

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O2

void __thiscall
compress_tests::compress_script_to_cscript_id::test_method(compress_script_to_cscript_id *this)

{
  long lVar1;
  CScript *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator pvVar6;
  iterator in_R9;
  bool *pbVar7;
  size_type *psVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined4 local_164;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  bool done;
  size_type local_fc;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 local_c8 [24];
  char *local_b0;
  CompressedScript out;
  CScript redeemScript;
  CScript script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  script.super_CScriptBase._union._16_8_ = 0;
  script.super_CScriptBase._24_8_ = 0;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  script.super_CScriptBase._union._8_8_ = 0;
  redeemScript.super_CScriptBase._union._16_8_ = 0;
  redeemScript.super_CScriptBase._24_8_ = 0;
  redeemScript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  redeemScript.super_CScriptBase._union._8_8_ = 0;
  pCVar2 = CScript::operator<<(&script,OP_HASH160);
  CScriptID::CScriptID((CScriptID *)local_c8,&redeemScript);
  ToByteVector<CScriptID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out,(CScriptID *)local_c8);
  pCVar2 = CScript::operator<<(pCVar2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out)
  ;
  CScript::operator<<(pCVar2,OP_EQUAL);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&out);
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5a;
  file.m_begin = (iterator)&local_d8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
  out._union._8_8_ = out._union._8_8_ & 0xffffffffffffff00;
  out._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011480b0;
  out._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  out._union._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_f0 = "";
  local_c8._0_4_ = script.super_CScriptBase._size - 0x1d;
  if (script.super_CScriptBase._size < 0x1d) {
    local_c8._0_4_ = script.super_CScriptBase._size;
  }
  pvVar6 = local_c8;
  local_fc = 0x17;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&out,&local_f8,0x5a,1,2,pvVar6,"script.size()",&local_fc,"23U");
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  out._union.direct[0x20] = '\0';
  out._size = 0;
  done = CompressScript(&script,&out);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5e;
  file_00.m_begin = (iterator)&local_110;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_128 = "";
  local_fc = CONCAT31(local_fc._1_3_,1);
  pvVar6 = (iterator)0x2;
  pbVar7 = &done;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_c8,&local_130,0x5e,1,2,pbVar7,"done",&local_fc,"true");
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x61;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pbVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_158 = "";
  local_fc = out._size - 0x22;
  if (out._size < 0x22) {
    local_fc = out._size;
  }
  local_164 = 0x15;
  pvVar6 = (iterator)0x2;
  psVar8 = &local_fc;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_c8,&local_160,0x61,1,2,&local_fc,"out.size()",&local_164,"21U");
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x62;
  file_02.m_begin = (iterator)&local_178;
  msg_02.m_end = (iterator)psVar8;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_188,
             msg_02);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_190 = "";
  uVar4 = &out;
  if (0x21 < out._size) {
    uVar4 = out._union.indirect_contents.indirect;
  }
  local_fc = 1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_c8,&local_198,0x62,1,2,uVar4,"out[0]",&local_fc,"0x01");
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x63;
  file_03.m_begin = (iterator)&local_1a8;
  msg_03.m_end = (iterator)uVar4;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b8,
             msg_03);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1c0 = "";
  uVar4 = out._union.indirect_contents.indirect;
  if (out._size < 0x22) {
    uVar4 = &out;
  }
  uVar3 = &script;
  if (0x1c < script.super_CScriptBase._size) {
    uVar3 = script.super_CScriptBase._union.indirect_contents.indirect;
  }
  local_fc = memcmp((void *)((long)&((CompressedScript *)uVar4)->_union + 1),
                    (void *)((long)&(((CScript *)uVar3)->super_CScriptBase)._union + 2),0x14);
  local_164 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_c8,&local_1c8,99,1,2,&local_fc,"memcmp(out.data() + 1, script.data() + 2, 20)",
             &local_164,"0");
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector(&out);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&redeemScript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_script_to_cscript_id)
{
    // case CScriptID
    CScript script, redeemScript;
    script << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK_EQUAL(script.size(), 23U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, true);

    // Check compressed script
    BOOST_CHECK_EQUAL(out.size(), 21U);
    BOOST_CHECK_EQUAL(out[0], 0x01);
    BOOST_CHECK_EQUAL(memcmp(out.data() + 1, script.data() + 2, 20), 0); // compare the 20 relevant chars of the CScriptId in the script
}